

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

Node * __thiscall
google::protobuf::Map<int,_proto2_unittest::TestIntIntMap>::CloneFromOther
          (Map<int,_proto2_unittest::TestIntIntMap> *this,
          Map<int,_proto2_unittest::TestIntIntMap> *other)

{
  Arena *ptr;
  TestIntIntMap *this_00;
  Node *pNVar1;
  Node *pNVar2;
  uint uVar3;
  ulong uVar4;
  Node *pNVar5;
  
  uVar3 = (other->super_KeyMapBase<unsigned_int>).super_UntypedMapBase.index_of_first_non_null_;
  uVar4 = (ulong)uVar3;
  if (uVar3 == (other->super_KeyMapBase<unsigned_int>).super_UntypedMapBase.num_buckets_) {
    uVar4 = 0;
    pNVar2 = (Node *)0x0;
  }
  else {
    pNVar2 = (Node *)(other->super_KeyMapBase<unsigned_int>).super_UntypedMapBase.table_[uVar4];
    if (pNVar2 == (Node *)0x0) {
      protobuf::internal::protobuf_assumption_failed
                ("node != nullptr",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.h"
                 ,0x22e);
    }
  }
  if (pNVar2 == (Node *)0x0) {
    pNVar1 = (Node *)0x0;
  }
  else {
    pNVar5 = (Node *)0x0;
    do {
      pNVar1 = (Node *)protobuf::internal::UntypedMapBase::AllocNode((UntypedMapBase *)this,0x58);
      (pNVar1->kv).first = (pNVar2->kv).first;
      ptr = (this->super_KeyMapBase<unsigned_int>).super_UntypedMapBase.arena_;
      (pNVar1->kv).second.super_Message.super_MessageLite._internal_metadata_.ptr_ = (intptr_t)ptr;
      (pNVar1->kv).second.super_Message.super_MessageLite._vptr_MessageLite =
           (_func_int **)&PTR__TestIntIntMap_0195b120;
      protobuf::internal::MapFieldBaseForParse::MapFieldBaseForParse
                ((MapFieldBaseForParse *)&(pNVar1->kv).second.field_0._impl_,
                 (Message *)proto2_unittest::_TestIntIntMap_MEntry_DoNotUse_default_instance_,
                 (TaggedPtr)ptr);
      *(undefined1 **)
       ((long)&(pNVar1->kv).second.field_0._impl_.m_.super_TypeDefinedMapFieldBase<int,_int> + 0x10)
           = &DAT_100000000;
      *(undefined8 *)
       ((long)&(pNVar1->kv).second.field_0._impl_.m_.super_TypeDefinedMapFieldBase<int,_int> + 0x18)
           = 0x110c001000000001;
      *(undefined8 **)
       ((long)&(pNVar1->kv).second.field_0._impl_.m_.super_TypeDefinedMapFieldBase<int,_int> + 0x20)
           = &protobuf::internal::kGlobalEmptyTable;
      *(Arena **)
       ((long)&(pNVar1->kv).second.field_0._impl_.m_.super_TypeDefinedMapFieldBase<int,_int> + 0x28)
           = ptr;
      (pNVar1->kv).second.field_0._impl_._cached_size_.atom_ = 0;
      if (pNVar2 != pNVar1) {
        this_00 = &(pNVar1->kv).second;
        proto2_unittest::TestIntIntMap::Clear(this_00);
        proto2_unittest::TestIntIntMap::MergeImpl
                  ((MessageLite *)this_00,(MessageLite *)&(pNVar2->kv).second);
      }
      (pNVar1->super_KeyNode).super_NodeBase.next = (NodeBase *)pNVar5;
      pNVar2 = (Node *)(pNVar2->super_KeyNode).super_NodeBase.next;
      if (pNVar2 == (Node *)0x0) {
        do {
          uVar3 = (int)uVar4 + 1;
          uVar4 = (ulong)uVar3;
          if ((other->super_KeyMapBase<unsigned_int>).super_UntypedMapBase.num_buckets_ <= uVar3) {
            pNVar2 = (Node *)0x0;
            uVar4 = 0;
            break;
          }
          pNVar2 = (Node *)(other->super_KeyMapBase<unsigned_int>).super_UntypedMapBase.table_
                           [uVar3];
        } while (pNVar2 == (Node *)0x0);
      }
      pNVar5 = pNVar1;
    } while (pNVar2 != (Node *)0x0);
  }
  return pNVar1;
}

Assistant:

PROTOBUF_NOINLINE Node* CloneFromOther(const Map& other) {
    Node* head = nullptr;
    for (const auto& [key, value] : other) {
      Node* new_node;
      if constexpr (std::is_base_of_v<MessageLite, mapped_type>) {
        new_node = CreateNode(key);
        new_node->kv.second = value;
      } else {
        new_node = CreateNode(key, value);
      }
      new_node->next = head;
      head = new_node;
    }
    return head;
  }